

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O2

void brngHMACStepR(void *buf,size_t count,void *state)

{
  octet *mac;
  long *plVar1;
  void *dest;
  ulong count_00;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  plVar1 = (long *)((long)state + 0x90);
  count_00 = *(ulong *)((long)state + 0x90);
  if (count_00 != 0) {
    if (count <= count_00) {
      memCopy(buf,(void *)((long)plVar1 - count_00),count);
      lVar4 = *plVar1 - count;
      goto LAB_001327f7;
    }
    memCopy(buf,(void *)((long)plVar1 - count_00),count_00);
    count = count - *plVar1;
    buf = (void *)((long)buf + *plVar1);
    *plVar1 = 0;
  }
  dest = (void *)((long)state + 0x98);
  mac = (octet *)((long)state + 0x50);
  for (; 0x1f < count; count = count - 0x20) {
    sVar2 = beltHMAC_keep();
    sVar3 = beltHMAC_keep();
    memCopy(dest,(void *)(sVar2 + (long)dest),sVar3);
    beltHMACStepA(mac,0x20,dest);
    beltHMACStepG(mac,dest);
    beltHMACStepA(*state,*(size_t *)((long)state + 0x48),dest);
    beltHMACStepG((octet *)buf,dest);
    buf = (void *)((long)buf + 0x20);
  }
  if (count == 0) {
    return;
  }
  sVar2 = beltHMAC_keep();
  sVar3 = beltHMAC_keep();
  memCopy(dest,(void *)(sVar2 + (long)dest),sVar3);
  beltHMACStepA(mac,0x20,dest);
  beltHMACStepG(mac,dest);
  beltHMACStepA(*state,*(size_t *)((long)state + 0x48),dest);
  beltHMACStepG((octet *)((long)state + 0x70),dest);
  memCopy(buf,(octet *)((long)state + 0x70),count);
  lVar4 = 0x20 - count;
LAB_001327f7:
  *plVar1 = lVar4;
  return;
}

Assistant:

void brngHMACStepR(void* buf, size_t count, void* state)
{
	brng_hmac_st* s = (brng_hmac_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngHMAC_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// r <- beltHMAC(key, r) 
		memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
		beltHMACStepA(s->r, 32, s->state_ex);
		beltHMACStepG(s->r, s->state_ex);
		// Y_t <- beltHMAC(key, r || iv)
		beltHMACStepA(s->iv, s->iv_len, s->state_ex);
		beltHMACStepG(buf, s->state_ex);
		// next
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// r <- beltHMAC(key, r) 
		memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
		beltHMACStepA(s->r, 32, s->state_ex);
		beltHMACStepG(s->r, s->state_ex);
		// Y_t <- left(beltHMAC(key, r || iv))
		beltHMACStepA(s->iv, s->iv_len, s->state_ex);
		beltHMACStepG(s->block, s->state_ex);
		memCopy(buf, s->block, count);
		// next
		s->reserved = 32 - count;
	}
}